

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

TimingOf<std::chrono::_V2::system_clock,_nonius::detail::repeater<nonius::now<std::chrono::_V2::system_clock>_>_(run_for_at_least_argument_t<system_clock,_repeater<now<system_clock>_>_>)>
 nonius::detail::
 run_for_at_least<std::chrono::_V2::system_clock,nonius::detail::repeater<nonius::now<std::chrono::_V2::system_clock>>>
           (parameters *params,Duration<std::chrono::_V2::system_clock> how_long,int seed,
           repeater<nonius::now<std::chrono::_V2::system_clock>_> *fun)

{
  undefined8 *puVar1;
  TimingOf<std::chrono::_V2::system_clock,_nonius::detail::repeater<nonius::now<std::chrono::_V2::system_clock>_>_&(int)>
  TVar2;
  TimingOf<std::chrono::_V2::system_clock,_nonius::detail::repeater<nonius::now<std::chrono::_V2::system_clock>_>_(run_for_at_least_argument_t<system_clock,_repeater<now<system_clock>_>_>)>
  TVar3;
  
  while( true ) {
    if (0x3fffffff < seed) {
      puVar1 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar1 = &PTR__exception_002232c0;
      __cxa_throw(puVar1,&optimized_away_error::typeinfo,std::exception::~exception);
    }
    TVar2 = measure_one<std::chrono::_V2::system_clock,nonius::detail::repeater<nonius::now<std::chrono::_V2::system_clock>>&>
                      (fun,seed,params);
    TVar3.elapsed = TVar2.elapsed.__r;
    if (how_long.__r <= TVar3.elapsed.__r) break;
    seed = seed * 2;
  }
  TVar3._8_8_ = (ulong)(uint)seed << 0x20;
  return TVar3;
}

Assistant:

TimingOf<Clock, Fun(run_for_at_least_argument_t<Clock, Fun>)> run_for_at_least(const parameters& params, Duration<Clock> how_long, int seed, Fun&& fun) {
            auto iters = seed;
            while(iters < (1 << 30)) {
                auto&& timing = measure_one<Clock>(fun, iters, params, detail::is_callable<Fun(chronometer)>());

                if(timing.elapsed >= how_long) {
                    return { timing.elapsed, std::move(timing.result), iters };
                }
                iters *= 2;
            }
            throw optimized_away_error{};
        }